

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# macho.cc
# Opt level: O0

void bloaty::macho::AddMachOFallback(RangeSink *sink)

{
  InputFile *pIVar1;
  RangeSink *in_RDI;
  RangeSink *unaff_retaddr;
  undefined1 in_stack_00000008 [16];
  string_view in_stack_00000018;
  undefined8 local_40;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffffd0;
  
  pIVar1 = RangeSink::input_file(in_RDI);
  InputFile::data(pIVar1);
  ForEachLoadCommand<bloaty::macho::AddMachOFallback(bloaty::RangeSink*)::__0>
            ((string_view)in_stack_00000008,unaff_retaddr,(anon_class_8_1_89918b91 *)in_RDI);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_ffffffffffffffd0,local_40);
  pIVar1 = RangeSink::input_file(in_RDI);
  InputFile::data(pIVar1);
  RangeSink::AddFileRange
            (unaff_retaddr,(char *)in_RDI,in_stack_00000018,(string_view)in_stack_00000008);
  return;
}

Assistant:

static void AddMachOFallback(RangeSink* sink) {
  ForEachLoadCommand(
      sink->input_file().data(), sink,
      [sink](const LoadCommand& cmd) {
        switch (cmd.cmd) {
          case LC_SEGMENT_64:
            AddSegmentAsFallback<segment_command_64, section_64>(
                cmd.command_data, cmd.file_data, sink);
            break;
          case LC_SEGMENT:
            AddSegmentAsFallback<segment_command, section>(cmd.command_data,
                                                           cmd.file_data, sink);
            break;
        }
      });
  sink->AddFileRange("macho_fallback", "[Unmapped]", sink->input_file().data());
}